

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O3

LY_ERR lyplg_ext_sprinter_ptree_add_ext_nodes
                 (lyspr_tree_ctx *ctx,lysp_ext_instance *ext,
                 lyplg_ext_sprinter_ptree_override_clb clb)

{
  ly_stmt lVar1;
  lysp_ext_substmt *plVar2;
  bool bVar3;
  LY_ERR LVar4;
  void **ppvVar5;
  void **ppvVar6;
  char *pcVar7;
  
  if (ctx == (lyspr_tree_ctx *)0x0) {
    pcVar7 = "ctx";
  }
  else {
    if (ext != (lysp_ext_instance *)0x0) {
      plVar2 = ext->substmts;
      if (plVar2 == (lysp_ext_substmt *)0x0) {
        return LY_SUCCESS;
      }
      if (plVar2[-1].storage_p == (void **)0x0) {
        return LY_SUCCESS;
      }
      ppvVar5 = (void **)0x0;
      ppvVar6 = (void **)0x1;
      do {
        lVar1 = plVar2[(long)ppvVar5].stmt;
        if ((int)lVar1 < 0x100) {
          if ((lVar1 - LY_STMT_NOTIFICATION < 0x40) &&
             ((0x800000008000808bU >> ((ulong)(lVar1 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0))
          goto LAB_0019d06c;
        }
        else if ((int)lVar1 < 0x1000) {
          if (((lVar1 == LY_STMT_CASE) || (lVar1 == LY_STMT_CHOICE)) || (lVar1 == LY_STMT_CONTAINER)
             ) {
LAB_0019d06c:
            if ((lysp_node *)*plVar2[(long)ppvVar5].storage_p != (lysp_node *)0x0) {
              LVar4 = lyplg_ext_sprinter_ptree_add_nodes
                                (ctx,(lysp_node *)*plVar2[(long)ppvVar5].storage_p,clb);
              return LVar4;
            }
          }
        }
        else if (((lVar1 == LY_STMT_LEAF) || (lVar1 == LY_STMT_LIST)) ||
                (lVar1 == LY_STMT_LEAF_LIST)) goto LAB_0019d06c;
        bVar3 = plVar2[-1].storage_p <= ppvVar6;
        ppvVar5 = ppvVar6;
        ppvVar6 = (void **)(ulong)((int)ppvVar6 + 1);
        if (bVar3) {
          return LY_SUCCESS;
        }
      } while( true );
    }
    pcVar7 = "ext";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar7,
         "lyplg_ext_sprinter_ptree_add_ext_nodes");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DECL LY_ERR
lyplg_ext_sprinter_ptree_add_ext_nodes(const struct lyspr_tree_ctx *ctx, struct lysp_ext_instance *ext,
        lyplg_ext_sprinter_ptree_override_clb clb)
{
    LY_ERR rc = LY_SUCCESS;
    uint32_t i;
    struct lysp_node *schema;

    LY_CHECK_ARG_RET(NULL, ctx, ext, LY_EINVAL);

    LY_ARRAY_FOR(ext->substmts, i) {
        switch (ext->substmts[i].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
            schema = *ext->substmts[i].storage_p;
            if (schema) {
                rc = lyplg_ext_sprinter_ptree_add_nodes(ctx, schema, clb);
                return rc;
            }
        default:
            break;
        }
    }

    return rc;
}